

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenSubdir
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  Quantity<long,_kj::_::NanosecondLabel> this_00;
  String *pSVar1;
  int iVar2;
  _func_int **pp_Var3;
  ArrayDisposer **ppAVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ArrayDisposer *pAVar7;
  undefined4 in_register_0000000c;
  long lVar8;
  Directory *pDVar9;
  Directory *extraout_RDX;
  Directory *extraout_RDX_00;
  Directory *extraout_RDX_01;
  _func_int **pp_Var10;
  Directory *extraout_RDX_02;
  Directory *extraout_RDX_03;
  Directory *extraout_RDX_04;
  Directory *extraout_RDX_05;
  Directory *extraout_RDX_06;
  Directory *extraout_RDX_07;
  Directory *extraout_RDX_08;
  _Base_ptr p_Var12;
  uint in_R8D;
  Exception *pEVar13;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar14;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_88 [24];
  Exception *local_70;
  Maybe<kj::_::Mutex::Waiter_&> MStack_68;
  Exception *local_60;
  DebugExpression<bool> local_58;
  undefined7 uStack_57;
  InMemoryFileFactory *local_50;
  Date local_48;
  String *pSStack_40;
  Directory *pDVar11;
  
  lVar8 = CONCAT44(in_register_0000000c,mode);
  pDVar9 = (Directory *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  if (lVar8 == 1) {
    this_00.value = (long)(name_00.content.ptr + 1);
    local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
    kj::_::Mutex::lock((Mutex *)this_00.value,0);
    pSVar1 = name_00.content.ptr + 2;
    pp_Var3 = pDVar9[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var3 == (_func_int **)0x0) {
      pp_Var10 = (_func_int **)0x237f1b;
    }
    else {
      pp_Var10 = (pDVar9->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    name.content.size_ = (size_t)pp_Var10;
    name.content.ptr = (char *)pSVar1;
    local_48.value.value =
         (Quantity<long,_kj::_::NanosecondLabel>)
         (Quantity<long,_kj::_::NanosecondLabel>)this_00.value;
    pSStack_40 = pSVar1;
    Impl::openEntry((Impl *)local_88,name,(int)pp_Var3 + (uint)(pp_Var3 == (_func_int **)0x0));
    uVar5 = local_88._0_8_;
    if ((Exception *)local_88._0_8_ == (Exception *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      pDVar11 = extraout_RDX_00;
    }
    else {
      iVar2 = *(int *)(local_88._0_8_ + 0x18);
      if (iVar2 == 0) {
        local_58.value = (bool)((byte)in_R8D & 1);
        if ((in_R8D & 1) == 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)local_88,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x6c8,FAILED,"has(mode, WriteMode::CREATE)","_kjCondition,",&local_58);
          kj::_::Debug::Fault::fatal((Fault *)local_88);
        }
        pAVar7 = (ArrayDisposer *)(*(code *)**(undefined8 **)(pSVar1->content).ptr)();
        name_00.content.ptr[4].content.disposer = pAVar7;
        newInMemoryDirectory
                  ((kj *)local_88,(Clock *)name_00.content.ptr[2].content.ptr,
                   (InMemoryFileFactory *)name_00.content.ptr[2].content.size_);
        local_70 = (Exception *)local_88._0_8_;
        MStack_68.ptr = (Waiter *)local_88._8_8_;
        EntryImpl::init((EntryImpl *)&local_58,(EVP_PKEY_CTX *)uVar5);
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)CONCAT71(uStack_57,local_58.value);
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_50;
        local_50 = (InMemoryFileFactory *)0x0;
        pDVar11 = extraout_RDX_04;
        if (MStack_68.ptr != (Waiter *)0x0) {
          MStack_68.ptr = (Waiter *)0x0;
          (**(code **)(local_70->ownFile).content.ptr)();
          pDVar11 = extraout_RDX_05;
        }
      }
      else if (iVar2 == 3) {
        SymlinkNode::parse((Path *)local_88,(SymlinkNode *)(local_88._0_8_ + 0x20));
        kj::_::Mutex::unlock((Mutex *)this_00.value,EXCLUSIVE,(Waiter *)0x0);
        local_48.value.value = (Quantity<long,_kj::_::NanosecondLabel>)0;
        pSStack_40 = (String *)0x0;
        path_00.parts.size_ = local_88._0_8_;
        path_00.parts.ptr = name_00.content.ptr;
        MVar14 = tryOpenSubdir(this,path_00,(WriteMode)local_88._8_8_);
        uVar6 = local_88._8_8_;
        uVar5 = local_88._0_8_;
        pDVar11 = MVar14.ptr.ptr;
        if ((Exception *)local_88._0_8_ != (Exception *)0x0) {
          local_88._0_8_ = (Exception *)0x0;
          local_88._8_8_ = (_Base_ptr)0x0;
          (***(_func_int ***)local_88._16_8_)
                    (local_88._16_8_,uVar5,0x18,uVar6,uVar6,
                     ArrayDisposer::Dispose_<kj::String>::destruct);
          pDVar11 = extraout_RDX_03;
        }
      }
      else if (iVar2 == 2) {
        (**(code **)(*(long *)(((String *)(local_88._0_8_ + 0x28))->content).ptr + 0x28))(local_88);
        p_Var12 = (_Base_ptr)local_88._8_8_;
        if ((_Base_ptr)local_88._8_8_ == (_Base_ptr)0x0) {
          p_Var12 = (_Base_ptr)0x0;
          pEVar13 = (Exception *)0x0;
        }
        else {
          local_88._8_8_ = (_Base_ptr)0x0;
          pEVar13 = (Exception *)local_88._0_8_;
        }
        pDVar11 = extraout_RDX_01;
        if ((_Base_ptr)local_88._8_8_ != (_Base_ptr)0x0) {
          local_88._8_8_ = (_Base_ptr)0x0;
          (**(code **)(((String *)local_88._0_8_)->content).ptr)();
          pDVar11 = extraout_RDX_07;
        }
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)pEVar13;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)p_Var12;
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
                  ((Fault *)local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x6cc,FAILED,(char *)0x0,"\"not a directory\"",(char (*) [16])0x20fd10);
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)local_88);
        pDVar11 = extraout_RDX_06;
      }
    }
    if (local_48.value.value != 0) {
      kj::_::Mutex::unlock((Mutex *)local_48.value.value,EXCLUSIVE,(Waiter *)0x0);
      pDVar11 = extraout_RDX_08;
    }
  }
  else if (lVar8 == 0) {
    pDVar11 = pDVar9;
    if ((in_R8D & 2) == 0) {
      if ((in_R8D & 1) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                  ((Fault *)local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x49f,FAILED,(char *)0x0,"\"can\'t replace self\"",
                   (char (*) [19])"can\'t replace self");
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)local_88);
        pDVar11 = extraout_RDX;
      }
      else {
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      }
    }
    else {
      LOCK();
      ppAVar4 = &((name_00.content.ptr)->content).disposer;
      *(int *)ppAVar4 = *(int *)ppAVar4 + 1;
      UNLOCK();
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)&((name_00.content.ptr)->content).size_;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
           (_func_int **)name_00.content.ptr;
    }
  }
  else {
    pp_Var3 = pDVar9[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var3 == (_func_int **)0x0) {
      pp_Var10 = (_func_int **)0x237f1b;
    }
    else {
      pp_Var10 = (pDVar9->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var10;
    MVar14 = tryGetParent((InMemoryDirectory *)local_88,name_00,
                          (int)pp_Var3 + (uint)(pp_Var3 == (_func_int **)0x0));
    pDVar11 = MVar14.ptr.ptr;
    local_60 = (Exception *)local_88._0_8_;
    if ((_Base_ptr)local_88._8_8_ == (_Base_ptr)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(_func_int **)local_88._8_8_ + 0x88))
                (this,local_88._8_8_,pDVar9 + 3,lVar8 + -1,in_R8D);
      (**(code **)(local_60->ownFile).content.ptr)
                (local_60,(InMemoryFileFactory *)
                          (local_88._8_8_ + *(long *)(*(_func_int **)local_88._8_8_ + -0x10)));
      pDVar11 = extraout_RDX_02;
    }
  }
  MVar14.ptr.ptr = pDVar11;
  MVar14.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>)MVar14.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        return atomicAddRef(*this);
      } else if (has(mode, WriteMode::CREATE)) {
        return kj::none;  // already exists
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return kj::none; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(path[0], mode)) {
        return asDirectory(lock, entry, mode);
      } else {
        return kj::none;
      }
    }